

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

int xmlIsMainThread(void)

{
  pthread_t __thread1;
  int iVar1;
  pthread_t __thread2;
  
  if (libxml_is_threaded == -1) {
    xmlInitThreads();
  }
  if (libxml_is_threaded != 0) {
    pthread_once(&once_control,xmlOnceInit);
    __thread1 = mainthread;
    __thread2 = pthread_self();
    iVar1 = pthread_equal(__thread1,__thread2);
    return iVar1;
  }
  return 1;
}

Assistant:

int
xmlIsMainThread(void)
{
#ifdef HAVE_POSIX_THREADS
    if (libxml_is_threaded == -1)
        xmlInitThreads();
    if (libxml_is_threaded == 0)
        return (1);
    pthread_once(&once_control, xmlOnceInit);
#elif defined HAVE_WIN32_THREADS
    xmlOnceInit();
#endif

#ifdef DEBUG_THREADS
    xmlGenericError(xmlGenericErrorContext, "xmlIsMainThread()\n");
#endif
#ifdef HAVE_POSIX_THREADS
    return (pthread_equal(mainthread,pthread_self()));
#elif defined HAVE_WIN32_THREADS
    return (mainthread == GetCurrentThreadId());
#else
    return (1);
#endif
}